

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.cpp
# Opt level: O3

vector<char,_std::allocator<char>_> *
convertToUTF8(vector<char,_std::allocator<char>_> *__return_storage_ptr__,
             vector<char,_std::allocator<char>_> *data)

{
  pointer pcVar1;
  uint8_t *puVar2;
  uint *puVar3;
  uint8_t *puVar4;
  unsigned_long uVar5;
  uchar *puVar6;
  long lVar7;
  char *__function;
  uint uVar8;
  vector<char,_std::allocator<char>_> *result;
  uint32_t *end;
  uint *puVar9;
  T_conflict *source;
  uint *puVar10;
  ulong uVar11;
  size_type sVar12;
  allocator_type local_37;
  allocator_type local_36;
  UTF8Writer local_35;
  allocator_type local_34;
  UTF8Writer local_33;
  allocator_type local_32;
  allocator_type local_31;
  
  puVar3 = (uint *)(data->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                   super__Vector_impl_data._M_start;
  pcVar1 = (data->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  uVar11 = (long)pcVar1 - (long)puVar3;
  puVar10 = (uint *)0x0;
  if (uVar11 != 0) {
    puVar10 = puVar3;
  }
  if (uVar11 < 4) {
    if (uVar11 < 2) goto LAB_0011b315;
    uVar8 = (uint)(ushort)*puVar10;
  }
  else {
    uVar8 = *puVar10;
    if (uVar8 == 0xfffe0000) {
      if (uVar11 - 4 < 4) {
LAB_0011b27b:
        (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        return __return_storage_ptr__;
      }
      puVar9 = (uint *)((long)puVar10 + (uVar11 - 4 & 0xfffffffffffffffc) + 4);
      puVar10 = puVar10 + 1;
      sVar12 = 0;
      puVar3 = puVar10;
      do {
        uVar8 = *puVar3;
        uVar8 = uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
        lVar7 = 1;
        if ((0x7f < uVar8) && (lVar7 = 2, 0x7ff < uVar8)) {
          lVar7 = 4 - (ulong)(uVar8 < 0x10000);
        }
        sVar12 = sVar12 + lVar7;
        puVar3 = puVar3 + 1;
      } while (puVar3 < puVar9);
      std::vector<char,_std::allocator<char>_>::vector(__return_storage_ptr__,sVar12,&local_34);
      if (sVar12 == 0) {
        return __return_storage_ptr__;
      }
      puVar2 = (uint8_t *)
               (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      puVar4 = puVar2;
      do {
        uVar8 = *puVar10;
        puVar4 = UTF8Writer::operator()
                           (&local_33,puVar4,
                            uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 |
                            uVar8 << 0x18);
        puVar10 = puVar10 + 1;
      } while (puVar10 < puVar9);
      if (puVar2 + sVar12 == puVar4) {
        return __return_storage_ptr__;
      }
      __function = 
      "std::vector<char> convertToUTF8Impl(const char *, size_t) [Decoder = UTF32Decoder<true>]";
      goto LAB_0011b3ed;
    }
    if (uVar8 == 0xfeff) {
      if (uVar11 - 4 < 4) goto LAB_0011b27b;
      puVar9 = (uint *)((long)puVar10 + (uVar11 - 4 & 0xfffffffffffffffc) + 4);
      puVar10 = puVar10 + 1;
      sVar12 = 0;
      puVar3 = puVar10;
      do {
        uVar8 = *puVar3;
        lVar7 = 1;
        if ((0x7f < uVar8) && (lVar7 = 2, 0x7ff < uVar8)) {
          lVar7 = 4 - (ulong)(uVar8 < 0x10000);
        }
        sVar12 = sVar12 + lVar7;
        puVar3 = puVar3 + 1;
      } while (puVar3 < puVar9);
      std::vector<char,_std::allocator<char>_>::vector(__return_storage_ptr__,sVar12,&local_36);
      if (sVar12 == 0) {
        return __return_storage_ptr__;
      }
      puVar2 = (uint8_t *)
               (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      puVar4 = puVar2;
      do {
        puVar4 = UTF8Writer::operator()(&local_35,puVar4,*puVar10);
        puVar10 = puVar10 + 1;
      } while (puVar10 < puVar9);
      if (puVar2 + sVar12 == puVar4) {
        return __return_storage_ptr__;
      }
      __function = 
      "std::vector<char> convertToUTF8Impl(const char *, size_t) [Decoder = UTF32Decoder<false>]";
      goto LAB_0011b3ed;
    }
  }
  if ((short)uVar8 == -2) {
    uVar11 = uVar11 - 2 >> 1;
    uVar5 = UTF16Decoder<true>::decode<unsigned_long,UTF8Counter>
                      ((ushort *)((long)puVar10 + 2),uVar11,0);
    std::vector<char,_std::allocator<char>_>::vector(__return_storage_ptr__,uVar5,&local_31);
    if (uVar5 == 0) {
      return __return_storage_ptr__;
    }
    pcVar1 = (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar6 = UTF16Decoder<true>::decode<unsigned_char*,UTF8Writer>
                       ((ushort *)((long)puVar10 + 2),uVar11,pcVar1);
    if ((uchar *)(pcVar1 + uVar5) == puVar6) {
      return __return_storage_ptr__;
    }
    __function = 
    "std::vector<char> convertToUTF8Impl(const char *, size_t) [Decoder = UTF16Decoder<true>]";
  }
  else {
    if ((uVar8 & 0xffff) != 0xfeff) {
      if ((2 < uVar11) && (*(char *)((long)puVar10 + 2) == -0x41 && (ushort)*puVar10 == 0xbbef)) {
        std::vector<char,std::allocator<char>>::vector<char_const*,void>
                  ((vector<char,std::allocator<char>> *)__return_storage_ptr__,
                   (char *)((long)puVar10 + 3),(char *)(uVar11 + (long)puVar10),&local_37);
        return __return_storage_ptr__;
      }
LAB_0011b315:
      (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)puVar3;
      (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
      super__Vector_impl_data._M_finish = pcVar1;
      (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (data->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
      (data->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      (data->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      (data->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      return __return_storage_ptr__;
    }
    uVar11 = uVar11 - 2 >> 1;
    uVar5 = UTF16Decoder<false>::decode<unsigned_long,UTF8Counter>
                      ((ushort *)((long)puVar10 + 2),uVar11,0);
    std::vector<char,_std::allocator<char>_>::vector(__return_storage_ptr__,uVar5,&local_32);
    if (uVar5 == 0) {
      return __return_storage_ptr__;
    }
    pcVar1 = (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar6 = UTF16Decoder<false>::decode<unsigned_char*,UTF8Writer>
                       ((ushort *)((long)puVar10 + 2),uVar11,pcVar1);
    if ((uchar *)(pcVar1 + uVar5) == puVar6) {
      return __return_storage_ptr__;
    }
    __function = 
    "std::vector<char> convertToUTF8Impl(const char *, size_t) [Decoder = UTF16Decoder<false>]";
  }
LAB_0011b3ed:
  __assert_fail("beg + utf8Length == end",
                "/workspace/llm4binary/github/license_c_cmakelists/zeux[P]qgrep/src/encoding.cpp",
                0x98,__function);
}

Assistant:

std::vector<char> convertToUTF8(std::vector<char> data)
{
	const char* contents = data.empty() ? 0 : &data[0];
	size_t size = data.size();

	if (size >= 4 && *reinterpret_cast<const uint32_t*>(contents) == 0x0000feff) return convertToUTF8Impl<UTF32Decoder<false>>(contents + 4, size - 4);
	if (size >= 4 && *reinterpret_cast<const uint32_t*>(contents) == 0xfffe0000) return convertToUTF8Impl<UTF32Decoder<true>>(contents + 4, size - 4);
	if (size >= 2 && *reinterpret_cast<const uint16_t*>(contents) == 0xfeff) return convertToUTF8Impl<UTF16Decoder<false>>(contents + 2, size - 2);
	if (size >= 2 && *reinterpret_cast<const uint16_t*>(contents) == 0xfffe) return convertToUTF8Impl<UTF16Decoder<true>>(contents + 2, size - 2);
	if (size >= 3 && memcmp(contents, "\xef\xbb\xbf", 3) == 0) return std::vector<char>(contents + 3, contents + size);

	return data;
}